

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O0

bool slang::ast::checkMatch(CaseStatementCondition condition,ConstantValue *cvl,ConstantValue *cvr)

{
  bool bVar1;
  ConstantValue *in_RDX;
  SVInt *in_RSI;
  int in_EDI;
  SVInt *r;
  SVInt *l;
  ConstantValue *elem;
  CVIterator<true> __end4;
  CVIterator<true> __begin4;
  ConstantValue *__range4;
  CVIterator<true> *in_stack_ffffffffffffff68;
  iterator_facade<slang::CVIterator<true>,_false> *in_stack_ffffffffffffff70;
  ConstantValue *in_stack_ffffffffffffff78;
  SVInt *in_stack_ffffffffffffffd0;
  SVInt *in_stack_ffffffffffffffd8;
  SVInt *in_stack_ffffffffffffffe0;
  ConstantValue *cvl_00;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_EDI == 3) {
    bVar1 = slang::ConstantValue::isContainer((ConstantValue *)in_stack_ffffffffffffff70);
    if (bVar1) {
      cvl_00 = in_RDX;
      begin<const_slang::ConstantValue,_true>(in_stack_ffffffffffffff78);
      end<const_slang::ConstantValue,_true>(in_stack_ffffffffffffff78);
      while( true ) {
        bVar1 = operator==<slang::CVIterator<true>_>
                          ((self_type *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          return false;
        }
        iterator_facade<slang::CVIterator<true>,_false>::operator*
                  ((iterator_facade<slang::CVIterator<true>,_false> *)0xa3484e);
        bVar1 = checkMatch((CaseStatementCondition)in_RSI,cvl_00,in_RDX);
        if (bVar1) break;
        iterator_facade<slang::CVIterator<true>,_false>::operator++<slang::CVIterator<true>_>
                  (in_stack_ffffffffffffff70);
      }
      return true;
    }
    bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xa348a7);
    if ((bVar1) && (bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xa348ba), bVar1)) {
      slang::ConstantValue::integer((ConstantValue *)0xa348cd);
      slang::ConstantValue::integer((ConstantValue *)0xa348de);
      condWildcardEqual(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      bVar1 = logic_t::operator_cast_to_bool((logic_t *)in_stack_ffffffffffffff70);
      return bVar1;
    }
  }
  else if (in_EDI != 0) {
    slang::ConstantValue::integer((ConstantValue *)0xa3491f);
    slang::ConstantValue::integer((ConstantValue *)0xa34931);
    if (in_EDI == 2) {
      bVar1 = caseZWildcardEqual((SVInt *)CONCAT44(in_stack_fffffffffffffffc,2),in_RSI);
      return bVar1;
    }
    bVar1 = caseXWildcardEqual((SVInt *)in_RDX,in_stack_ffffffffffffffe0);
    return bVar1;
  }
  bVar1 = slang::operator==((ConstantValue *)in_stack_ffffffffffffff70,
                            (ConstantValue *)in_stack_ffffffffffffff68);
  return bVar1;
}

Assistant:

static bool checkMatch(CaseStatementCondition condition, const ConstantValue& cvl,
                       const ConstantValue& cvr) {
    if (condition == CaseStatementCondition::Inside) {
        // Unpacked arrays get unwrapped into their members for comparison.
        if (cvr.isContainer()) {
            for (auto& elem : cvr) {
                if (checkMatch(condition, cvl, elem))
                    return true;
            }
            return false;
        }

        // Otherwise, we do a wildcard comparison if both sides are integers
        // and an equivalence comparison if not.
        if (cvl.isInteger() && cvr.isInteger())
            return (bool)condWildcardEqual(cvl.integer(), cvr.integer());
    }
    else if (condition != CaseStatementCondition::Normal) {
        const SVInt& l = cvl.integer();
        const SVInt& r = cvr.integer();
        if (condition == CaseStatementCondition::WildcardJustZ)
            return caseZWildcardEqual(l, r);
        else
            return caseXWildcardEqual(l, r);
    }

    return cvl == cvr;
}